

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O1

void __thiscall TSDemuxer::~TSDemuxer(TSDemuxer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (*this->m_bufferedReader->_vptr_AbstractReader[7])
            (this->m_bufferedReader,(ulong)(uint)this->m_readerID);
  std::vector<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>::~vector(&this->m_mplsInfo);
  std::
  _Rb_tree<int,_std::pair<const_int,_PMTStreamInfo>,_std::_Select1st<std::pair<const_int,_PMTStreamInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
  ::~_Rb_tree(&(this->m_pmt).pidList._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::~_Rb_tree(&(this->m_fullDtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::~_Rb_tree(&(this->m_fullPtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::~_Rb_tree(&(this->m_firstDtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::~_Rb_tree(&(this->m_firstPtsTime)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::~_Rb_tree(&(this->m_lastPesDts)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
  ::~_Rb_tree(&(this->m_lastPesPts)._M_t);
  pcVar2 = (this->m_streamNameLow)._M_dataplus._M_p;
  paVar1 = &(this->m_streamNameLow).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_streamName)._M_dataplus._M_p;
  paVar1 = &(this->m_streamName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  AbstractDemuxer::~AbstractDemuxer(&this->super_AbstractDemuxer);
  return;
}

Assistant:

TSDemuxer::~TSDemuxer() { m_bufferedReader->deleteReader(m_readerID); }